

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ObjComputeCuts(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge)

{
  word *pwVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  int *piVar5;
  word **ppwVar6;
  word *pwVar7;
  word *pwVar8;
  ulong *puVar9;
  ulong *puVar10;
  Vec_Int_t *p_00;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint *puVar17;
  byte bVar18;
  uint uVar19;
  int iVar20;
  undefined1 *puVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  int nLits_1;
  uint *puVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint *pCut0;
  long lVar32;
  ulong uVar33;
  int iVar34;
  long lVar35;
  bool bVar36;
  float fVar37;
  Jf_Cut_t *pSto [18];
  word Sign1 [18];
  word Sign0 [18];
  Jf_Cut_t Sto [18];
  uint *local_6c0;
  long local_698;
  long local_678 [18];
  word *local_5e8;
  uint *local_5e0;
  ulong auStack_5d8 [18];
  ulong auStack_548 [18];
  undefined1 local_4b8 [1160];
  
  pGVar3 = p->pGia->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->pGia->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar14 = p->pPars->nLutSize;
  uVar15 = p->pPars->nCutNum;
  iVar16 = (int)((long)pObj - (long)pGVar3 >> 2);
  uVar11 = iVar16 * -0x55555555;
  if (-2 < (int)uVar15) {
    puVar21 = local_4b8;
    uVar26 = 0;
    do {
      local_678[uVar26] = (long)puVar21;
      *(undefined8 *)(puVar21 + 0x10) = 0xffffffff;
      uVar26 = uVar26 + 1;
      puVar21 = puVar21 + 0x40;
    } while (uVar15 + 2 != uVar26);
  }
  uVar4 = *(undefined8 *)pObj;
  uVar12 = uVar11 - ((uint)uVar4 & 0x1fffffff);
  if ((-1 < (int)uVar12) && (iVar20 = (p->vCuts).nSize, (int)uVar12 < iVar20)) {
    piVar5 = (p->vCuts).pArray;
    uVar12 = piVar5[uVar12];
    ppwVar6 = (p->pMem).pPages;
    bVar18 = (byte)(p->pMem).nPageSize;
    pwVar7 = ppwVar6[(int)uVar12 >> (bVar18 & 0x1f)];
    uVar29 = (p->pMem).uPageMask;
    uVar12 = uVar12 & uVar29;
    pwVar1 = pwVar7 + (int)uVar12;
    pCut0 = (uint *)((long)pwVar1 + 4);
    iVar25 = (int)*pwVar1;
    if (0 < (long)iVar25) {
      lVar32 = 0;
      puVar17 = pCut0;
      do {
        uVar13 = *puVar17;
        if ((uVar13 & 0xf) == 0) {
          uVar26 = 0;
        }
        else {
          uVar22 = 0;
          uVar26 = 0;
          do {
            if ((int)puVar17[uVar22 + 1] < 0) goto LAB_0075299e;
            uVar26 = uVar26 | 1L << ((ulong)(byte)((byte)puVar17[uVar22 + 1] >> 1) & 0x3f);
            uVar22 = uVar22 + 1;
          } while ((uVar13 & 0xf) != uVar22);
        }
        auStack_548[lVar32] = uVar26;
        lVar32 = lVar32 + 1;
        puVar17 = puVar17 + ((ulong)uVar13 & 0xf) + 1;
      } while (lVar32 != iVar25);
    }
    uVar13 = uVar11 - ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff);
    if (((int)uVar13 < 0) || (iVar20 <= (int)uVar13)) goto LAB_007529dc;
    uVar13 = piVar5[uVar13];
    uVar29 = uVar29 & uVar13;
    pwVar8 = ppwVar6[(int)uVar13 >> (bVar18 & 0x1f)];
    pwVar1 = pwVar8 + (int)uVar29;
    puVar17 = (uint *)((long)pwVar1 + 4);
    iVar20 = (int)*pwVar1;
    if (0 < (long)iVar20) {
      lVar32 = 0;
      puVar28 = puVar17;
      do {
        uVar13 = *puVar28;
        if ((uVar13 & 0xf) == 0) {
          uVar26 = 0;
        }
        else {
          uVar22 = 0;
          uVar26 = 0;
          do {
            if ((int)puVar28[uVar22 + 1] < 0) goto LAB_0075299e;
            uVar26 = uVar26 | 1L << ((ulong)(byte)((byte)puVar28[uVar22 + 1] >> 1) & 0x3f);
            uVar22 = uVar22 + 1;
          } while ((uVar13 & 0xf) != uVar22);
        }
        auStack_5d8[lVar32] = uVar26;
        lVar32 = lVar32 + 1;
        puVar28 = puVar28 + ((ulong)uVar13 & 0xf) + 1;
      } while (lVar32 != iVar20);
    }
    p->CutCount[0] = p->CutCount[0] + (long)(iVar25 * iVar20);
    local_5e8 = pwVar7 + (int)uVar12;
    if ((int)*local_5e8 < 1) {
      uVar12 = 0;
    }
    else {
      pwVar8 = pwVar8 + (int)uVar29;
      local_698 = 0;
      uVar12 = 0;
      do {
        if (0 < (int)*pwVar8) {
          uVar26 = auStack_548[local_698];
          local_5e0 = pCut0 + 1;
          lVar32 = 0;
          local_6c0 = puVar17;
          do {
            uVar33 = auStack_5d8[lVar32] | uVar26;
            uVar22 = uVar33 - (uVar33 >> 1 & 0x5555555555555555);
            uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333);
            if ((int)(uint)(byte)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                 >> 0x38) <= (int)uVar14) {
              p->CutCount[1] = p->CutCount[1] + 1;
              lVar35 = (long)(int)uVar12;
              if (p->pPars->fCutMin == 0) {
                puVar10 = (ulong *)local_678[(int)uVar12];
                iVar20 = Jf_CutMergeOrder((int *)pCut0,(int *)local_6c0,(int *)(puVar10 + 3),uVar14)
                ;
                if (iVar20 != 0) {
                  *puVar10 = uVar33;
LAB_00752169:
                  p->CutCount[2] = p->CutCount[2] + 1;
                  iVar20 = 0;
                  if (p->pPars->fAreaOnly == 0) {
                    uVar29 = *(uint *)(local_678[(int)uVar12] + 0x18);
                    if ((uVar29 & 0xf) == 0) {
                      iVar20 = 1;
                    }
                    else {
                      uVar22 = 0;
                      iVar20 = 0;
                      do {
                        uVar13 = *(uint *)(local_678[(int)uVar12] + 0x1c + uVar22 * 4);
                        if ((int)uVar13 < 0) goto LAB_0075299e;
                        uVar13 = uVar13 >> 1;
                        if ((p->vArr).nSize <= (int)uVar13) goto LAB_007529dc;
                        iVar25 = (p->vArr).pArray[uVar13];
                        if (iVar20 <= iVar25) {
                          iVar20 = iVar25;
                        }
                        uVar22 = uVar22 + 1;
                      } while ((uVar29 & 0xf) != uVar22);
                      iVar20 = iVar20 + 1;
                    }
                  }
                  lVar23 = local_678[lVar35];
                  *(int *)(lVar23 + 0xc) = iVar20;
                  if ((*(uint *)(lVar23 + 0x18) & 0xf) == 0) {
                    fVar37 = 0.0;
                  }
                  else {
                    fVar37 = 0.0;
                    uVar22 = 0;
                    do {
                      uVar29 = *(uint *)(lVar23 + 0x1c + uVar22 * 4);
                      if ((int)uVar29 < 0) goto LAB_0075299e;
                      uVar29 = uVar29 >> 1;
                      if ((p->vFlow).nSize <= (int)uVar29) goto LAB_007529bd;
                      fVar37 = fVar37 + (p->vFlow).pArray[uVar29];
                      uVar22 = uVar22 + 1;
                    } while ((*(uint *)(lVar23 + 0x18) & 0xf) != uVar22);
                  }
                  if (fVar37 < 0.0) {
                    __assert_fail("Flow >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                  ,0x21b,"float Jf_CutFlow(Jf_Man_t *, int *)");
                  }
                  *(float *)(lVar23 + 8) = fVar37;
                  if (uVar12 == 0) {
                    uVar12 = 1;
                  }
                  else if ((uVar12 != uVar15) ||
                          (fVar37 = (*p->pCutCmp)((Jf_Cut_t *)local_678[lVar35 + -1],
                                                  (Jf_Cut_t *)local_678[lVar35]), 0.0 < fVar37)) {
                    if ((int)uVar15 < (int)uVar12) {
                      __assert_fail("c <= cMax",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                    ,0x3c9,
                                    "int Jf_ObjAddCutToStore(Jf_Man_t *, Jf_Cut_t **, int, int)");
                    }
                    uVar22 = (ulong)uVar12;
                    uVar29 = uVar12 + 1;
                    do {
                      uVar13 = (int)uVar12 >> 0x1f & uVar12;
                      if ((int)uVar22 < 1) break;
                      lVar23 = uVar22 - 1;
                      uVar22 = uVar22 - 1;
                      fVar37 = (*p->pCutCmp)((Jf_Cut_t *)local_678[lVar23],
                                             (Jf_Cut_t *)local_678[lVar35]);
                      uVar29 = uVar29 - 1;
                      uVar13 = uVar29;
                    } while (0.0 <= fVar37);
                    iVar20 = p->pPars->fCutMin;
                    if (iVar20 == 0) {
                      if (0 < (int)uVar13) {
                        puVar10 = (ulong *)local_678[lVar35];
                        uVar29 = (uint)puVar10[3] & 0xf;
                        uVar22 = 0;
                        do {
                          puVar9 = (ulong *)local_678[uVar22];
                          if (((int)(uint)puVar9[3] <= (int)(uint)puVar10[3]) &&
                             ((*puVar9 & ~*puVar10) == 0)) {
                            uVar31 = (uint)puVar9[3] & 0xf;
                            if (uVar29 == uVar31) {
                              if (uVar29 == 0) goto LAB_007525e7;
                              uVar33 = 0;
                              while (*(int *)((long)puVar10 + uVar33 * 4 + 0x1c) ==
                                     *(int *)((long)puVar9 + uVar33 * 4 + 0x1c)) {
                                uVar33 = uVar33 + 1;
                                if (uVar29 == uVar33) goto LAB_007525e7;
                              }
                            }
                            else {
                              if (uVar29 <= uVar31) goto LAB_00752a8d;
                              uVar30 = 1;
                              uVar33 = 0;
                              do {
                                iVar25 = *(int *)((long)puVar9 + (long)(int)uVar30 * 4 + 0x18);
                                iVar34 = *(int *)((long)puVar10 + uVar33 * 4 + 0x1c);
                                if (iVar25 < iVar34) break;
                                if (iVar34 == iVar25) {
                                  if (uVar30 == uVar31) goto LAB_007525e7;
                                  uVar30 = uVar30 + 1;
                                }
                                uVar33 = uVar33 + 1;
                              } while (uVar29 != uVar33);
                            }
                          }
                          uVar22 = uVar22 + 1;
                        } while (uVar22 != uVar13);
                      }
                    }
                    else if (0 < (int)uVar13) {
                      puVar10 = (ulong *)local_678[lVar35];
                      uVar29 = (uint)puVar10[3];
                      uVar31 = uVar29 & 0xf;
                      uVar22 = 0;
                      do {
                        puVar9 = (ulong *)local_678[uVar22];
                        uVar30 = (uint)puVar9[3];
                        if (((int)uVar30 <= (int)uVar29) && ((*puVar9 & ~*puVar10) == 0)) {
                          if ((uVar30 & 0xf) != 0) {
                            lVar23 = 1;
                            do {
                              uVar27 = *(uint *)((long)puVar9 + lVar23 * 4 + 0x18);
                              if ((int)uVar27 < 0) goto LAB_0075299e;
                              if (uVar31 == 0) {
                                iVar25 = 1;
                              }
                              else {
                                uVar33 = 0;
                                do {
                                  uVar19 = *(uint *)((long)puVar10 + uVar33 * 4 + 0x1c);
                                  if ((int)uVar19 < 0) goto LAB_0075299e;
                                  if ((uVar19 ^ uVar27) < 2) {
                                    iVar25 = (int)uVar33 + 1;
                                    break;
                                  }
                                  uVar33 = uVar33 + 1;
                                  iVar25 = uVar31 + 1;
                                } while (uVar31 != uVar33);
                              }
                              if ((int)uVar29 < iVar25) goto LAB_0075234b;
                              lVar23 = lVar23 + 1;
                              if (lVar23 == ((ulong)uVar30 & 0xf) + 1) break;
                            } while( true );
                          }
                          goto LAB_007525e7;
                        }
LAB_0075234b:
                        uVar22 = uVar22 + 1;
                      } while (uVar22 != uVar13);
                    }
                    lVar23 = local_678[lVar35];
                    lVar24 = (long)(int)uVar13;
                    if ((int)uVar13 < (int)uVar12) {
                      do {
                        local_678[lVar35] = local_678[lVar35 + -1];
                        lVar35 = lVar35 + -1;
                      } while (lVar24 < lVar35);
                    }
                    iVar25 = uVar13 + 1;
                    local_678[lVar24] = lVar23;
                    if (iVar20 == 0) {
                      if ((int)uVar13 < (int)uVar12) {
                        lVar35 = lVar24 + 1;
                        do {
                          puVar10 = (ulong *)local_678[lVar24];
                          puVar9 = (ulong *)local_678[lVar35];
                          if (((int)(uint)puVar9[3] < (int)(uint)puVar10[3]) ||
                             ((*puVar10 & ~*puVar9) != 0)) {
LAB_007525aa:
                            iVar20 = iVar25 + 1;
                            if (iVar25 != (int)lVar35) {
                              lVar23 = local_678[iVar25];
                              local_678[iVar25] = (long)puVar9;
                              local_678[lVar35] = lVar23;
                            }
                          }
                          else {
                            uVar29 = (uint)puVar9[3] & 0xf;
                            uVar13 = (uint)puVar10[3] & 0xf;
                            iVar20 = iVar25;
                            if (uVar29 != uVar13) {
                              if (uVar29 <= uVar13) {
LAB_00752a8d:
                                __assert_fail("nSizeB > nSizeC",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                              ,0x236,"int Jf_CutIsContainedOrder(int *, int *)");
                              }
                              uVar31 = 1;
                              uVar22 = 0;
                              do {
                                iVar34 = *(int *)((long)puVar10 + (long)(int)uVar31 * 4 + 0x18);
                                iVar2 = *(int *)((long)puVar9 + uVar22 * 4 + 0x1c);
                                if (iVar34 < iVar2) break;
                                if (iVar2 == iVar34) {
                                  if (uVar31 == uVar13) goto LAB_007525c3;
                                  uVar31 = uVar31 + 1;
                                }
                                uVar22 = uVar22 + 1;
                              } while (uVar29 != uVar22);
                              goto LAB_007525aa;
                            }
                            if (uVar29 != 0) {
                              uVar22 = 0;
                              do {
                                if (*(int *)((long)puVar9 + uVar22 * 4 + 0x1c) !=
                                    *(int *)((long)puVar10 + uVar22 * 4 + 0x1c)) goto LAB_007525aa;
                                uVar22 = uVar22 + 1;
                              } while (uVar29 != uVar22);
                            }
                          }
LAB_007525c3:
                          iVar25 = iVar20;
                          lVar35 = lVar35 + 1;
                        } while (uVar12 + 1 != (int)lVar35);
                      }
                    }
                    else if ((int)uVar13 < (int)uVar12) {
                      lVar35 = lVar24 + 1;
                      do {
                        puVar10 = (ulong *)local_678[lVar24];
                        uVar29 = (uint)puVar10[3];
                        puVar9 = (ulong *)local_678[lVar35];
                        uVar13 = (uint)puVar9[3];
                        if (((int)uVar13 < (int)uVar29) || ((*puVar10 & ~*puVar9) != 0)) {
LAB_007524dd:
                          iVar20 = iVar25 + 1;
                          if (iVar25 != (int)lVar35) {
                            lVar23 = local_678[iVar25];
                            local_678[iVar25] = (long)puVar9;
                            local_678[lVar35] = lVar23;
                          }
                        }
                        else {
                          iVar20 = iVar25;
                          if ((uVar29 & 0xf) != 0) {
                            uVar31 = uVar13 & 0xf;
                            lVar23 = 1;
                            do {
                              uVar30 = *(uint *)((long)puVar10 + lVar23 * 4 + 0x18);
                              if ((int)uVar30 < 0) goto LAB_0075299e;
                              if (uVar31 == 0) {
                                iVar34 = 1;
                              }
                              else {
                                uVar22 = 0;
                                do {
                                  uVar27 = *(uint *)((long)puVar9 + uVar22 * 4 + 0x1c);
                                  if ((int)uVar27 < 0) goto LAB_0075299e;
                                  if ((uVar27 ^ uVar30) < 2) {
                                    iVar34 = (int)uVar22 + 1;
                                    break;
                                  }
                                  uVar22 = uVar22 + 1;
                                  iVar34 = uVar31 + 1;
                                } while (uVar31 != uVar22);
                              }
                              if ((int)uVar13 < iVar34) goto LAB_007524dd;
                              lVar23 = lVar23 + 1;
                            } while (lVar23 != ((ulong)uVar29 & 0xf) + 1);
                          }
                        }
                        iVar25 = iVar20;
                        lVar35 = lVar35 + 1;
                      } while (uVar12 + 1 != (int)lVar35);
                    }
                    uVar12 = iVar25 - (uint)(iVar25 == uVar15 + 1);
                  }
LAB_007525e7:
                  if ((int)uVar15 < (int)uVar12) {
                    __assert_fail("c <= CutNum",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                  ,0x4ab,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
                  }
                }
              }
              else {
                puVar9 = (ulong *)local_678[lVar35];
                puVar10 = puVar9 + 3;
                if (p->pPars->fFuncDsd == 0) {
                  iVar20 = Jf_CutMergeOrder((int *)pCut0,(int *)local_6c0,(int *)puVar10,uVar14);
                  if (iVar20 != 0) {
                    *puVar9 = uVar33;
                    uVar22 = puVar9[3];
                    uVar13 = Jf_TtComputeForCut(p,(uint)(*(ulong *)pObj >> 0x1d) & 1 ^ *pCut0 >> 8,
                                                (uint)(*(ulong *)pObj >> 0x3d) & 1 ^ *local_6c0 >> 8
                                                ,(int *)pCut0,(int *)local_6c0,(int *)puVar10);
                    *(uint *)(puVar9 + 2) = uVar13;
                    uVar29 = (uint)puVar9[3];
                    if ((int)uVar22 < (int)uVar29) {
                      __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                    ,0x4a1,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
                    }
                    if ((int)uVar29 < (int)uVar22) {
                      if ((uVar29 & 0xf) == 0) {
                        uVar22 = 0;
                      }
                      else {
                        uVar33 = 0;
                        uVar22 = 0;
                        do {
                          iVar20 = *(int *)((long)puVar9 + uVar33 * 4 + 0x1c);
                          if (iVar20 < 0) goto LAB_0075299e;
                          uVar22 = uVar22 | 1L << ((ulong)(byte)((byte)iVar20 >> 1) & 0x3f);
                          uVar33 = uVar33 + 1;
                        } while ((uVar29 & 0xf) != uVar33);
                      }
                      *puVar9 = uVar22;
                    }
                    if (0xffffff < uVar13) {
                      puts(
                          "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting..."
                          );
                      exit(1);
                    }
                    goto LAB_00752169;
                  }
                }
                else {
                  uVar13 = *pCut0 & 0xf;
                  uVar29 = *local_6c0;
                  *(uint *)puVar10 = uVar13;
                  if ((uVar29 & 0xf) == 0) {
                    uVar31 = 0x3ffff;
                  }
                  else {
                    uVar31 = 0x3ffff;
                    lVar23 = 1;
                    do {
                      uVar30 = local_6c0[lVar23];
                      if ((int)uVar30 < 0) goto LAB_0075299e;
                      uVar27 = *pCut0 & 0xf;
                      if (uVar27 == 0) {
                        uVar19 = 1;
                      }
                      else {
                        uVar19 = uVar27 + 1;
                        uVar22 = 1;
                        do {
                          if ((int)pCut0[uVar22] < 0) goto LAB_0075299e;
                          if ((pCut0[uVar22] ^ uVar30) < 2) {
                            uVar19 = (uint)uVar22;
                            break;
                          }
                          bVar36 = uVar22 != uVar27;
                          uVar22 = uVar22 + 1;
                        } while (bVar36);
                      }
                      if ((int)uVar13 < (int)uVar19) {
                        uVar27 = (uint)*puVar10;
                        if (uVar27 == uVar14) {
                          uVar31 = 0;
                          goto LAB_00752043;
                        }
                        uVar19 = uVar27 + 1;
                        *(uint *)puVar10 = uVar19;
                        *(uint *)((long)puVar9 + (long)(int)uVar27 * 4 + 0x1c) = uVar30;
                      }
                      else if (pCut0[(int)uVar19] != uVar30) {
                        uVar31 = uVar31 | 1 << (uVar19 + 0x11 & 0x1f);
                      }
                      uVar31 = uVar31 ^ ((int)lVar23 - 1U ^ 7) <<
                                        ((char)uVar19 * '\x03' - 3U & 0x1f);
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != ((ulong)uVar29 & 0xf) + 1);
                  }
                  memcpy((void *)((long)puVar9 + 0x1c),local_5e0,(ulong)(uVar13 << 2));
LAB_00752043:
                  if (uVar31 != 0) {
                    *puVar9 = uVar33;
                    uVar22 = puVar9[3];
                    uVar29 = Sdm_ManComputeFunc(p->pDsd,(uint)(*(ulong *)pObj >> 0x1d) & 1 ^
                                                        *pCut0 >> 8,
                                                (uint)(*(ulong *)pObj >> 0x3d) & 1 ^ *local_6c0 >> 8
                                                ,(int *)puVar10,uVar31,0);
                    *(uint *)(puVar9 + 2) = uVar29;
                    if (uVar29 != 0xffffffff) {
                      if (p->pPars->fGenCnf != 0) {
                        if ((int)uVar29 < 0) goto LAB_0075299e;
                        if (p->vCnfs->nSize <= (int)(uVar29 >> 1)) goto LAB_007529dc;
                        if (0xb < p->vCnfs->pArray[uVar29 >> 1]) goto LAB_00752629;
                      }
                      uVar29 = (uint)*puVar10;
                      if ((int)uVar22 < (int)uVar29) {
                        __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                      ,0x496,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)")
                        ;
                      }
                      if ((int)uVar29 < (int)uVar22) {
                        if ((uVar29 & 0xf) == 0) {
                          uVar22 = 0;
                        }
                        else {
                          uVar33 = 0;
                          uVar22 = 0;
                          do {
                            uVar13 = *(uint *)((long)puVar9 + uVar33 * 4 + 0x1c);
                            if ((int)uVar13 < 0) goto LAB_0075299e;
                            uVar22 = uVar22 | 1L << ((ulong)(uVar13 >> 1 & 0x7f) & 0x3f);
                            uVar33 = uVar33 + 1;
                          } while ((uVar29 & 0xf) != uVar33);
                        }
                        *puVar9 = uVar22;
                      }
                      goto LAB_00752169;
                    }
                  }
                }
              }
            }
LAB_00752629:
            lVar32 = lVar32 + 1;
            local_6c0 = local_6c0 + (ulong)(*local_6c0 & 0xf) + 1;
          } while (lVar32 < (int)*pwVar8);
        }
        local_698 = local_698 + 1;
        pCut0 = pCut0 + (ulong)(*pCut0 & 0xf) + 1;
      } while (local_698 < (int)*local_5e8);
    }
    uVar14 = (uint)*(undefined8 *)pObj;
    if ((uVar14 >> 0x1e & 1) != 0) {
      if (0 < (int)uVar12) {
        uVar26 = 0;
        do {
          if (*(int *)(local_678[uVar26] + 0x18) < 3) goto LAB_00752760;
          uVar26 = uVar26 + 1;
        } while (uVar12 != uVar26);
      }
      if (((pObj[-(ulong)(uVar14 & 0x1fffffff)].field_0x3 & 0x40) != 0) ||
         ((pObj[-(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff)].field_0x3 & 0x40)
          != 0)) {
        __assert_fail("Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x4b2,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      if (p->pPars->fCutMin != 0) {
        *(undefined4 *)(local_678[(int)uVar12] + 0x10) = 4;
      }
      lVar32 = local_678[(int)uVar12];
      *(undefined4 *)(lVar32 + 0x18) = 2;
      iVar20 = uVar11 - (*(uint *)pObj & 0x1fffffff);
      if (iVar20 < 0) goto LAB_00752b09;
      *(uint *)(lVar32 + 0x1c) = (*(uint *)pObj >> 0x1d & 1) + iVar20 * 2;
      uVar14 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      iVar20 = uVar11 - (uVar14 & 0x1fffffff);
      if (iVar20 < 0) goto LAB_00752b09;
      *(uint *)(lVar32 + 0x20) = (uVar14 >> 0x1d & 1) + iVar20 * 2;
      uVar12 = uVar12 + 1;
    }
LAB_00752760:
    if ((pObj->field_0x3 & 0x40) == 0) {
      iVar20 = p->pPars->fCutMin;
      if (iVar20 != 0) {
        if (0 < (int)uVar12) {
          uVar26 = 0;
          do {
            if (*(int *)(local_678[uVar26] + 0x18) < 2) goto LAB_007527cd;
            uVar26 = uVar26 + 1;
          } while (uVar12 != uVar26);
        }
        if (iVar20 != 0) {
          *(undefined4 *)(local_678[(int)uVar12] + 0x10) = 2;
        }
      }
      lVar32 = local_678[(int)uVar12];
      *(undefined4 *)(lVar32 + 0x18) = 1;
      if ((int)uVar11 < 0) {
LAB_00752b09:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      *(int *)(lVar32 + 0x1c) = iVar16 * 0x55555556;
      uVar12 = uVar12 + 1;
    }
LAB_007527cd:
    if (p->pPars->fGenCnf == 0) {
      iVar16 = 1;
    }
    else {
      if ((int)*(uint *)(local_678[0] + 0x10) < 0) {
LAB_0075299e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar14 = *(uint *)(local_678[0] + 0x10) >> 1;
      if (p->vCnfs->nSize <= (int)uVar14) goto LAB_007529dc;
      iVar16 = p->vCnfs->pArray[uVar14];
    }
    *(int *)(local_678[0] + 0x14) = iVar16;
    if (iVar16 < 0) {
      __assert_fail("pSto[0]->Cost >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x4c6,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
    }
    fVar37 = *(float *)(local_678[0] + 8);
    if (fVar37 < 0.0) {
      __assert_fail("pSto[0]->Flow >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x4c8,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
    }
    if ((-1 < (int)uVar11) && ((int)uVar11 < (p->vArr).nSize)) {
      uVar14 = uVar11 & 0x7fffffff;
      (p->vArr).pArray[uVar14] = *(int *)(local_678[0] + 0xc);
      if ((p->vRefs).nSize <= (int)uVar11) {
LAB_007529bd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      if ((p->vFlow).nSize <= (int)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      (p->vFlow).pArray[uVar14] =
           (fVar37 + (float)*(int *)(local_678[0] + 0x14 + (ulong)(fEdge != 0) * 4)) /
           (p->vRefs).pArray[uVar14];
      p_00 = p->vTemp;
      p_00->nSize = 0;
      Vec_IntPush(p_00,uVar12);
      if (0 < (int)uVar12) {
        uVar26 = 0;
        do {
          if (p->pPars->fGenCnf == 0) {
            iVar16 = 1;
          }
          else {
            if ((int)*(uint *)(local_678[uVar26] + 0x10) < 0) goto LAB_0075299e;
            uVar15 = *(uint *)(local_678[uVar26] + 0x10) >> 1;
            if (p->vCnfs->nSize <= (int)uVar15) goto LAB_007529dc;
            iVar16 = p->vCnfs->pArray[uVar15];
          }
          lVar32 = local_678[uVar26];
          *(int *)(lVar32 + 0x14) = iVar16;
          Vec_IntPush(p->vTemp,iVar16 << 4 | *(int *)(lVar32 + 0x10) << 8 | *(uint *)(lVar32 + 0x18)
                     );
          if (0 < *(int *)(lVar32 + 0x18)) {
            lVar35 = 0;
            do {
              Vec_IntPush(p->vTemp,*(int *)(lVar32 + 0x1c + lVar35 * 4));
              lVar35 = lVar35 + 1;
            } while (lVar35 < *(int *)(lVar32 + 0x18));
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar12);
      }
      iVar16 = Vec_SetAppend(&p->pMem,p->vTemp->pArray,p->vTemp->nSize);
      if ((int)uVar11 < (p->vCuts).nSize) {
        (p->vCuts).pArray[uVar14] = iVar16;
        p->CutCount[3] = p->CutCount[3] + (long)(int)uVar12;
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_007529dc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Jf_ObjComputeCuts( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge )
{
    int        LutSize = p->pPars->nLutSize;
    int        CutNum = p->pPars->nCutNum;
    int        iObj = Gia_ObjId(p->pGia, pObj);
    word       Sign0[JF_CUT_MAX+2]; // signatures of the first cut
    word       Sign1[JF_CUT_MAX+2]; // signatures of the second cut
    Jf_Cut_t   Sto[JF_CUT_MAX+2];   // cut storage
    Jf_Cut_t * pSto[JF_CUT_MAX+2];  // pointers to cut storage
    int *      pCut0, * pCut1, * pCuts0, * pCuts1;
    int        nOldSupp, Config, i, k, c = 0;
    // prepare cuts
    for ( i = 0; i <= CutNum+1; i++ )
        pSto[i] = Sto + i, pSto[i]->Cost = 0, pSto[i]->iFunc = ~0;
    // compute signatures
    pCuts0 = Jf_ObjCuts( p, Gia_ObjFaninId0(pObj, iObj) );
    Jf_ObjForEachCut( pCuts0, pCut0, i )
        Sign0[i] = Jf_CutGetSign( pCut0 );
    // compute signatures
    pCuts1 = Jf_ObjCuts( p, Gia_ObjFaninId1(pObj, iObj) );
    Jf_ObjForEachCut( pCuts1, pCut1, i )
        Sign1[i] = Jf_CutGetSign( pCut1 );
    // merge cuts
    p->CutCount[0] += pCuts0[0] * pCuts1[0];
    Jf_ObjForEachCut( pCuts0, pCut0, i )
    Jf_ObjForEachCut( pCuts1, pCut1, k )
    {
        if ( Jf_CountBits(Sign0[i] | Sign1[k]) > LutSize )
            continue;
        p->CutCount[1]++;        
        if ( !p->pPars->fCutMin )
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
        }
        else if ( p->pPars->fFuncDsd )
        {
            if ( !(Config = Jf_CutMerge2(pCut0, pCut1, pSto[c]->pCut, LutSize)) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Sdm_ManComputeFunc( p->pDsd, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pSto[c]->pCut, Config, 0 );
            if ( pSto[c]->iFunc == -1 )
                continue;
            if ( p->pPars->fGenCnf && Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[c]->iFunc)) >= 12 ) // no more than 15
                continue;
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
        }
        else
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Jf_TtComputeForCut( p, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pCut0, pCut1, pSto[c]->pCut );
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
            if ( pSto[c]->iFunc >= (1 << 24) )
                printf( "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting...\n" ), exit(1);
        }
        p->CutCount[2]++;
        pSto[c]->Time = p->pPars->fAreaOnly ? 0 : Jf_CutArr(p, pSto[c]->pCut);
        pSto[c]->Flow = Jf_CutFlow(p, pSto[c]->pCut);
        c = Jf_ObjAddCutToStore( p, pSto, c, CutNum );
        assert( c <= CutNum );
    }
//    Jf_ObjPrintStore( p, pSto, c );
//    Jf_ObjCheckStore( p, pSto, c, iObj );
    // add two variable cut
    if ( !Jf_ObjIsUnit(pObj) && !Jf_ObjHasCutWithSize(pSto, c, 2) )
    {
        assert( Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj)) );
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 4;  // set function (DSD only!)
        pSto[c]->pCut[0] = 2; 
        pSto[c]->pCut[1] = Jf_ObjLit(Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj)); 
        pSto[c]->pCut[2] = Jf_ObjLit(Gia_ObjFaninId1(pObj, iObj), Gia_ObjFaninC1(pObj)); 
        c++;
    }
    // add elementary cut
    if ( Jf_ObjIsUnit(pObj) && !(p->pPars->fCutMin && Jf_ObjHasCutWithSize(pSto, c, 1)) )
    {
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 2;  // set function
        pSto[c]->pCut[0] = 1;
        pSto[c]->pCut[1] = Jf_ObjLit(iObj, 0);
        c++;
    }
    // reorder cuts
//    Jf_ObjSortCuts( pSto + 1, c - 1 );
//    Jf_ObjCheckPtrs( pSto, CutNum );
    // find cost of the best cut
    pSto[0]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[0]->iFunc)) : 1;
    assert( pSto[0]->Cost >= 0 );
    // save best info
    assert( pSto[0]->Flow >= 0 );
    Vec_IntWriteEntry( &p->vArr,  iObj, pSto[0]->Time );
    Vec_FltWriteEntry( &p->vFlow, iObj, (pSto[0]->Flow + (fEdge ? pSto[0]->pCut[0] : pSto[0]->Cost)) / Jf_ObjRefs(p, iObj) );
    // add cuts to storage cuts
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, c );
    for ( i = 0; i < c; i++ )
    {
        pSto[i]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[i]->iFunc)) : 1;
        Vec_IntPush( p->vTemp, Jf_CutSetAll(pSto[i]->iFunc, pSto[i]->Cost, pSto[i]->pCut[0]) );
        for ( k = 1; k <= pSto[i]->pCut[0]; k++ )
            Vec_IntPush( p->vTemp, pSto[i]->pCut[k] );
    }
    Vec_IntWriteEntry( &p->vCuts, iObj, Vec_SetAppend(&p->pMem, Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp)) );
    p->CutCount[3] += c;
}